

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::VariableExpr> __thiscall minja::Parser::parseIdentifier(Parser *this)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::VariableExpr> sVar2;
  Location location;
  string ident;
  
  if (parseIdentifier()::ident_regex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&parseIdentifier()::ident_regex_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseIdentifier()::ident_regex_abi_cxx11_,
                 "(?!(?:not|is|and|or|del)\\b)[a-zA-Z_]\\w*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseIdentifier()::ident_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseIdentifier()::ident_regex_abi_cxx11_);
    }
  }
  get_location(&location,in_RSI);
  consumeToken(&ident,in_RSI,&parseIdentifier()::ident_regex_abi_cxx11_,Strip);
  if (ident._M_string_length == 0) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::make_shared<minja::VariableExpr,minja::Location&,std::__cxx11::string&>
              ((Location *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location);
  }
  std::__cxx11::string::~string((string *)&ident);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&location.source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar2.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::VariableExpr>)
         sVar2.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VariableExpr> parseIdentifier() {
        static std::regex ident_regex(R"((?!(?:not|is|and|or|del)\b)[a-zA-Z_]\w*)");
        auto location = get_location();
        auto ident = consumeToken(ident_regex);
        if (ident.empty())
          return nullptr;
        return std::make_shared<VariableExpr>(location, ident);
    }